

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wi_stuff.cpp
# Opt level: O0

void WI_loadData(void)

{
  char *mapname;
  FString local_10;
  level_info_t *li;
  
  FPatchInfo::Init(&entering,&gameinfo.mStatscreenEnteringFont);
  FPatchInfo::Init(&finished,&gameinfo.mStatscreenFinishedFont);
  FPatchInfo::Init(&::mapname,&gameinfo.mStatscreenMapNameFont);
  if ((gameinfo.gametype & GAME_DoomChex) != GAME_Any) {
    kills = FTextureManager::operator[](&TexMan,"WIOSTK");
    secret = FTextureManager::operator[](&TexMan,"WIOSTS");
    sp_secret = FTextureManager::operator[](&TexMan,"WISCRT2");
    items = FTextureManager::operator[](&TexMan,"WIOSTI");
    frags = FTextureManager::operator[](&TexMan,"WIFRGS");
    timepic = FTextureManager::operator[](&TexMan,"WITIME");
    sucks = FTextureManager::operator[](&TexMan,"WISUCKS");
    par = FTextureManager::operator[](&TexMan,"WIPAR");
    killers = FTextureManager::operator[](&TexMan,"WIKILRS");
    victims = FTextureManager::operator[](&TexMan,"WIVCTMS");
    total = FTextureManager::operator[](&TexMan,"WIMSTT");
    p = FTextureManager::operator[](&TexMan,"STPBANY");
  }
  FString::operator=(lnametexts,&level.LevelName);
  mapname = FString::operator_cast_to_char_(&wbs->next);
  local_10.Chars = (char *)FindLevelInfo(mapname,true);
  if ((level_info_t *)local_10.Chars == (level_info_t *)0x0) {
    FString::operator=(lnametexts + 1,"");
  }
  else {
    level_info_t::LookupLevelName((level_info_t *)&stack0xffffffffffffffe8);
    FString::operator=(lnametexts + 1,(FString *)&stack0xffffffffffffffe8);
    FString::~FString((FString *)&stack0xffffffffffffffe8);
  }
  WI_LoadBackground(false);
  return;
}

Assistant:

void WI_loadData(void)
{
	entering.Init(gameinfo.mStatscreenEnteringFont);
	finished.Init(gameinfo.mStatscreenFinishedFont);
	mapname.Init(gameinfo.mStatscreenMapNameFont);

	if (gameinfo.gametype & GAME_DoomChex)
	{
		kills = TexMan["WIOSTK"];		// "kills"
		secret = TexMan["WIOSTS"];		// "scrt"
		sp_secret = TexMan["WISCRT2"];	// "secret"
		items = TexMan["WIOSTI"];		// "items"
		frags = TexMan["WIFRGS"];		// "frgs"
		timepic = TexMan["WITIME"];		// "time"
		sucks = TexMan["WISUCKS"];		// "sucks"
		par = TexMan["WIPAR"];			// "par"
		killers = TexMan["WIKILRS"];	// "killers" (vertical]
		victims = TexMan["WIVCTMS"];	// "victims" (horiz]
		total = TexMan["WIMSTT"];		// "total"
//		star = TexMan["STFST01"];		// your face
//		bstar = TexMan["STFDEAD0"];		// dead face
 		p = TexMan["STPBANY"];
	}
#if 0
	else if (gameinfo.gametype & GAME_Raven)
	{
		if (gameinfo.gametype == GAME_Heretic)
		{
			star = TexMan["FACEA0"];
			bstar = TexMan["FACEB0"];
		}
		else
		{
			star = BigFont->GetChar('*', NULL);
			bstar = star;
		}
	}
	else // Strife needs some handling, too!
	{
		star = BigFont->GetChar('*', NULL);
		bstar = star;
	}
#endif

	// Use the local level structure which can be overridden by hubs
	lnametexts[0] = level.LevelName;		

	level_info_t *li = FindLevelInfo(wbs->next);
	if (li) lnametexts[1] = li->LookupLevelName();
	else lnametexts[1] = "";

	WI_LoadBackground(false);
}